

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_frozen_serialize(void **param_1)

{
  roaring64_bitmap_t *r;
  
  r = roaring64_bitmap_create();
  check_frozen_serialization((roaring64_bitmap_t *)r);
  roaring64_bitmap_add(r,0);
  roaring64_bitmap_remove(r,0);
  check_frozen_serialization((roaring64_bitmap_t *)r);
  roaring64_bitmap_add(r,0);
  roaring64_bitmap_add(r,1);
  roaring64_bitmap_add(r,0x10000);
  roaring64_bitmap_add(r,0x100000000);
  roaring64_bitmap_add(r,0x1000000000000);
  roaring64_bitmap_add(r,0x1000000000000000);
  roaring64_bitmap_add(r,0xffffffffffffffff);
  check_frozen_serialization((roaring64_bitmap_t *)r);
  roaring64_bitmap_add_range(r,0x10000,0x100000000);
  check_frozen_serialization((roaring64_bitmap_t *)r);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_frozen_serialize) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    check_frozen_serialization(r);

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_remove(r, 0);
    check_frozen_serialization(r);

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 1);
    roaring64_bitmap_add(r, 1ULL << 16);
    roaring64_bitmap_add(r, 1ULL << 32);
    roaring64_bitmap_add(r, 1ULL << 48);
    roaring64_bitmap_add(r, 1ULL << 60);
    roaring64_bitmap_add(r, UINT64_MAX);
    check_frozen_serialization(r);

    roaring64_bitmap_add_range(r, 1ULL << 16, 1ULL << 32);
    check_frozen_serialization(r);

    roaring64_bitmap_free(r);
}